

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableMapFieldGenerator::GenerateBuilderParsingCode
          (ImmutableMapFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  JavaType JVar2;
  FieldDescriptor *field;
  MessageLite *pMVar3;
  EnumDescriptor *pEVar4;
  char *pcVar5;
  size_t sVar6;
  string_view text;
  
  field = MapValueField(this->descriptor_);
  JVar2 = GetJavaType(field);
  if (JVar2 == JAVATYPE_MESSAGE) {
    pcVar5 = 
    "com.google.protobuf.MapEntry<$type_parameters$>\n$name$__ = input.readMessage(\n    $default_entry$.getParserForType(), extensionRegistry);\ninternalGetMutable$capitalized_name$().ensureBuilderMap().put(\n    $name$__.getKey(), $name$__.getValue());\n$set_has_field_bit_builder$\n"
    ;
    sVar6 = 0x112;
    goto LAB_003263f4;
  }
  pMVar3 = protobuf::internal::ExtensionSet::GetMessage
                     (&(field->merged_features_->field_0)._impl_._extensions_,pb::java,
                      (MessageLite *)PTR__JavaFeatures_default_instance__00855a30);
  if (*(char *)((long)&pMVar3[1]._internal_metadata_.ptr_ + 4) == '\0') {
    pEVar4 = FieldDescriptor::enum_type(field);
    if (pEVar4 == (EnumDescriptor *)0x0) goto LAB_003263cb;
    pEVar4 = FieldDescriptor::enum_type(field);
    bVar1 = EnumDescriptor::is_closed(pEVar4);
    bVar1 = !bVar1;
  }
  else {
LAB_003263cb:
    bVar1 = false;
  }
  if ((JVar2 != JAVATYPE_ENUM) || (bVar1)) {
    pcVar5 = 
    "com.google.protobuf.MapEntry<$type_parameters$>\n$name$__ = input.readMessage(\n    $default_entry$.getParserForType(), extensionRegistry);\ninternalGetMutable$capitalized_name$().getMutableMap().put(\n    $name$__.getKey(), $name$__.getValue());\n$set_has_field_bit_builder$\n"
    ;
    sVar6 = 0x10f;
  }
  else {
    pcVar5 = 
    "com.google.protobuf.ByteString bytes = input.readBytes();\ncom.google.protobuf.MapEntry<$type_parameters$>\n$name$__ = $default_entry$.getParserForType().parseFrom(bytes);\nif ($value_enum_type$.forNumber($name$__.getValue()) == null) {\n  mergeUnknownLengthDelimitedField($number$, bytes);\n} else {\n  internalGetMutable$capitalized_name$().getMutableMap().put(\n      $name$__.getKey(), $name$__.getValue());\n  $set_has_field_bit_builder$\n}\n"
    ;
    sVar6 = 0x1b5;
  }
LAB_003263f4:
  text._M_str = pcVar5;
  text._M_len = sVar6;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&this->variables_,text);
  return;
}

Assistant:

void ImmutableMapFieldGenerator::GenerateBuilderParsingCode(
    io::Printer* printer) const {
  const FieldDescriptor* value = MapValueField(descriptor_);
  const JavaType type = GetJavaType(value);
  if (type == JAVATYPE_MESSAGE) {
    printer->Print(
        variables_,
        "com.google.protobuf.MapEntry<$type_parameters$>\n"
        "$name$__ = input.readMessage(\n"
        "    $default_entry$.getParserForType(), extensionRegistry);\n"
        "internalGetMutable$capitalized_name$().ensureBuilderMap().put(\n"
        "    $name$__.getKey(), $name$__.getValue());\n"
        "$set_has_field_bit_builder$\n");
    return;
  }
  if (!SupportUnknownEnumValue(value) && type == JAVATYPE_ENUM) {
    printer->Print(
        variables_,
        "com.google.protobuf.ByteString bytes = input.readBytes();\n"
        "com.google.protobuf.MapEntry<$type_parameters$>\n"
        "$name$__ = $default_entry$.getParserForType().parseFrom(bytes);\n"
        "if ($value_enum_type$.forNumber($name$__.getValue()) == null) {\n"
        "  mergeUnknownLengthDelimitedField($number$, bytes);\n"
        "} else {\n"
        "  internalGetMutable$capitalized_name$().getMutableMap().put(\n"
        "      $name$__.getKey(), $name$__.getValue());\n"
        "  $set_has_field_bit_builder$\n"
        "}\n");
    return;
  }
  printer->Print(variables_,
                 "com.google.protobuf.MapEntry<$type_parameters$>\n"
                 "$name$__ = input.readMessage(\n"
                 "    $default_entry$.getParserForType(), extensionRegistry);\n"
                 "internalGetMutable$capitalized_name$().getMutableMap().put(\n"
                 "    $name$__.getKey(), $name$__.getValue());\n"
                 "$set_has_field_bit_builder$\n");
}